

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<long_double>::Diagonal(TPZMatrix<long_double> *this,longdouble val)

{
  long lVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZBaseMatrix *in_RDI;
  int64_t col;
  int64_t row;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  longdouble local_38;
  long local_28;
  long local_20;
  undefined1 local_18 [24];
  
  iVar2 = TPZBaseMatrix::Cols(in_RDI);
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar2 != iVar3) {
    Error(in_stack_000001b0,in_stack_000001a8);
  }
  local_20 = 0;
  while( true ) {
    lVar1 = local_20;
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar2 <= lVar1) break;
    local_28 = 0;
    while( true ) {
      lVar1 = local_28;
      iVar2 = TPZBaseMatrix::Cols(in_RDI);
      if (iVar2 <= lVar1) break;
      if (local_20 == local_28) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_28,local_18);
      }
      else {
        local_38 = (longdouble)0;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_28,&local_38);
      }
      local_28 = local_28 + 1;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}